

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O2

int comex_init_args(int *argc,char ***argv)

{
  int init_flag;
  int local_1c;
  
  MPI_Initialized(&local_1c);
  if (local_1c == 0) {
    MPI_Init(argc,argv);
  }
  comex_init();
  return 0;
}

Assistant:

int comex_init_args(int *argc, char ***argv)
{
    int rc;
    int init_flag;
    
    MPI_Initialized(&init_flag);
    
    if(!init_flag)
        MPI_Init(argc, argv);
    
    rc = comex_init();
    return rc;
}